

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86_avx::forward_inplace
          (Scale_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  void *pvVar7;
  int *piVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  float *pfVar12;
  undefined1 (*pauVar13) [12];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  __m256 _p_13;
  __m256 _s_13;
  int remain_1;
  int nn_1;
  float s_1;
  float *ptr_13;
  int q_5;
  float *scale_ptr_1;
  __m256 _p_12;
  __m256 _bias_6;
  __m256 _s_12;
  int remain;
  int nn;
  float bias_2;
  float s;
  float *ptr_12;
  int q_4;
  float *bias_ptr;
  float *scale_ptr;
  int size;
  int channels;
  int h;
  int w;
  __m128 _p_11;
  int i_11;
  __m128 _s_11;
  float *ptr_11;
  int q_3;
  __m128 _p_10;
  int i_10;
  __m128 _bias_5;
  __m128 _s_10;
  float *ptr_10;
  int q_2;
  int size_2;
  int channels_2;
  int h_4;
  int w_6;
  __m128 _p_9;
  int j_3;
  __m128 _s_9;
  float *ptr_9;
  int i_9;
  __m128 _p_8;
  int j_2;
  __m128 _bias_4;
  __m128 _s_8;
  float *ptr_8;
  int i_8;
  int h_3;
  int w_5;
  __m128 _s_7;
  __m128 _p_7;
  float *ptr_7;
  int i_7;
  __m128 _bias_3;
  __m128 _s_6;
  __m128 _p_6;
  float *ptr_6;
  int i_6;
  float *bias_1;
  float *scale_1;
  int w_4;
  __m256 _p_5;
  int i_5;
  __m256 _s_5;
  float *ptr_5;
  int q_1;
  __m256 _p_4;
  int i_4;
  __m256 _bias_2;
  __m256 _s_4;
  float *ptr_4;
  int q;
  int size_1;
  int channels_1;
  int h_2;
  int w_3;
  __m256 _p_3;
  int j_1;
  __m256 _s_3;
  float *ptr_3;
  int i_3;
  __m256 _p_2;
  int j;
  __m256 _bias_1;
  __m256 _s_2;
  float *ptr_2;
  int i_2;
  int h_1;
  int w_2;
  __m256 _s_1;
  __m256 _p_1;
  float *ptr_1;
  int i_1;
  __m256 _bias;
  __m256 _s;
  __m256 _p;
  float *ptr;
  int i;
  float *bias;
  float *scale;
  int w_1;
  int elempack;
  int dims;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  undefined8 in_stack_ffffffffffffece8;
  Mat *this_00;
  Mat *in_stack_ffffffffffffecf0;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  uint local_126c;
  int local_1268;
  Mat local_1260;
  float *local_1218;
  int local_120c;
  float *local_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  Option *in_stack_ffffffffffffee28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_ffffffffffffee30;
  Scale *in_stack_ffffffffffffee38;
  uint local_1198;
  int local_1194;
  Mat local_1188;
  Mat *local_1140;
  int local_1134;
  float *local_1130;
  float *local_1128;
  uint local_1120;
  int local_111c;
  int local_1118;
  int local_1114;
  float local_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  int local_10f4;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  Mat local_10d8;
  undefined1 (*local_1090) [12];
  int local_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  int local_1064;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 local_1050;
  undefined8 uStack_1048;
  Mat local_1038;
  float *local_ff0;
  int local_fe4;
  int local_fe0;
  int local_fdc;
  int local_fd8;
  int local_fd4;
  float local_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  int local_fb4;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  undefined1 (*local_fa0) [12];
  int local_f94;
  undefined8 local_f90;
  undefined8 uStack_f88;
  int local_f74;
  undefined8 local_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  float *local_f48;
  int local_f3c;
  int local_f38;
  int local_f34;
  undefined8 local_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  undefined1 (*local_f10) [12];
  int local_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  float *local_ec8;
  int local_ebc;
  float *local_eb8;
  float *local_eb0;
  int local_ea4;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  int local_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  Mat local_e38;
  float *local_df0;
  int local_de4;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  int local_da4;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  Mat local_d48;
  float *local_d00;
  int local_cf4;
  int local_cf0;
  int local_cec;
  int local_ce8;
  int local_ce4;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  int local_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float *local_c70;
  int local_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  int local_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float *local_bd8;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  float *local_b70;
  int local_b64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  float *local_ae8;
  int local_adc;
  float *local_ad8;
  float *local_ad0;
  int local_ac4;
  int local_ac0;
  int local_abc;
  reference local_ab8;
  reference local_ab0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_aa0;
  int local_a8c;
  float *local_a88;
  Mat *local_a80;
  float *local_a78;
  float *local_a70;
  float *local_a68;
  float *local_a60;
  float *local_a58;
  float *local_a50;
  float *local_a48;
  float *local_a40;
  float *local_a38;
  float *local_a30;
  float *local_a28;
  float *local_a20;
  float *local_a18;
  float *local_a10;
  float *local_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float *local_848;
  void *local_840;
  int *piStack_838;
  size_t sStack_830;
  undefined8 uStack_828;
  Mat *local_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float *local_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float *local_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float *local_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float *local_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 (*local_468) [12];
  float *local_460;
  float *local_458;
  float *local_450;
  float *local_448;
  undefined1 (*local_440) [12];
  float *local_438;
  float *local_430;
  float *local_428;
  float *local_420;
  float *local_418;
  undefined1 (*local_410) [12];
  float *local_408;
  float *local_400;
  float *local_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [16];
  undefined8 local_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 (*local_2b8) [12];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float *local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 (*local_278) [12];
  undefined8 local_270;
  undefined8 uStack_268;
  float *local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 (*local_238) [12];
  undefined8 local_230;
  undefined8 uStack_228;
  float *local_218;
  float local_20c;
  float local_208;
  float local_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_aa0 = in_RSI;
  local_ab0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_ab8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_aa0,1);
  local_abc = local_ab0->dims;
  local_ac0 = local_ab0->elempack;
  if (local_ac0 == 8) {
    if (local_abc == 1) {
      local_ac4 = local_ab0->w;
      local_ad0 = ncnn::Mat::operator_cast_to_float_(local_ab8);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_b64 = 0; local_b64 < local_ac4; local_b64 = local_b64 + 1) {
          local_b70 = ncnn::Mat::operator_cast_to_float_(local_ab0);
          local_b70 = local_b70 + (local_b64 << 3);
          uVar3 = *(undefined8 *)local_b70;
          uVar4 = *(undefined8 *)(local_b70 + 2);
          uVar5 = *(undefined8 *)(local_b70 + 4);
          uVar6 = *(undefined8 *)(local_b70 + 6);
          local_a28 = local_ad0 + (local_b64 << 3);
          local_bc0 = *(undefined8 *)local_a28;
          uStack_bb8 = *(undefined8 *)(local_a28 + 2);
          uStack_bb0 = *(undefined8 *)(local_a28 + 4);
          uStack_ba8 = *(undefined8 *)(local_a28 + 6);
          local_4a0._0_4_ = (float)uVar3;
          local_4a0._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_498._0_4_ = (float)uVar4;
          uStack_498._4_4_ = (float)((ulong)uVar4 >> 0x20);
          uStack_490._0_4_ = (float)uVar5;
          uStack_490._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_488._0_4_ = (float)uVar6;
          uStack_488._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          local_4c0._0_4_ = (float)local_bc0;
          local_4c0._4_4_ = (float)((ulong)local_bc0 >> 0x20);
          uStack_4b8._0_4_ = (float)uStack_bb8;
          uStack_4b8._4_4_ = (float)((ulong)uStack_bb8 >> 0x20);
          uStack_4b0._0_4_ = (float)uStack_bb0;
          uStack_4b0._4_4_ = (float)((ulong)uStack_bb0 >> 0x20);
          uStack_4a8._0_4_ = (float)uStack_ba8;
          local_ba0 = CONCAT44(local_4a0._4_4_ * local_4c0._4_4_,(float)local_4a0 * (float)local_4c0
                              );
          uStack_b98 = CONCAT44(uStack_498._4_4_ * uStack_4b8._4_4_,
                                (float)uStack_498 * (float)uStack_4b8);
          uStack_b90 = CONCAT44(uStack_490._4_4_ * uStack_4b0._4_4_,
                                (float)uStack_490 * (float)uStack_4b0);
          uStack_b88 = CONCAT44(uStack_488._4_4_,(float)uStack_488 * (float)uStack_4a8);
          local_700 = local_ba0;
          uStack_6f8 = uStack_b98;
          uStack_6f0 = uStack_b90;
          uStack_6e8 = uStack_b88;
          *(undefined8 *)local_b70 = local_ba0;
          *(undefined8 *)(local_b70 + 2) = uStack_b98;
          *(undefined8 *)(local_b70 + 4) = uStack_b90;
          *(undefined8 *)(local_b70 + 6) = uStack_b88;
          local_a20 = local_b70;
          local_6c8 = local_b70;
          local_4c0 = local_bc0;
          uStack_4b8 = uStack_bb8;
          uStack_4b0 = uStack_bb0;
          uStack_4a8 = uStack_ba8;
          local_4a0 = uVar3;
          uStack_498 = uVar4;
          uStack_490 = uVar5;
          uStack_488 = uVar6;
        }
      }
      else {
        local_ad8 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
        for (local_adc = 0; local_adc < local_ac4; local_adc = local_adc + 1) {
          local_ae8 = ncnn::Mat::operator_cast_to_float_(local_ab0);
          local_ae8 = local_ae8 + (local_adc << 3);
          uVar3 = *(undefined8 *)local_ae8;
          uVar4 = *(undefined8 *)(local_ae8 + 2);
          uVar5 = *(undefined8 *)(local_ae8 + 4);
          uVar6 = *(undefined8 *)(local_ae8 + 6);
          local_a10 = local_ad0 + (local_adc << 3);
          local_b40 = *(undefined8 *)local_a10;
          uStack_b38 = *(undefined8 *)(local_a10 + 2);
          uStack_b30 = *(undefined8 *)(local_a10 + 4);
          uStack_b28 = *(undefined8 *)(local_a10 + 6);
          local_a18 = local_ad8 + (local_adc << 3);
          local_b60 = *(undefined8 *)local_a18;
          uStack_b58 = *(undefined8 *)(local_a18 + 2);
          uStack_b50 = *(undefined8 *)(local_a18 + 4);
          uStack_b48 = *(undefined8 *)(local_a18 + 6);
          local_8a0._0_4_ = (float)uVar3;
          local_660 = (float)local_8a0;
          local_8a0._4_4_ = (float)((ulong)uVar3 >> 0x20);
          fStack_65c = local_8a0._4_4_;
          uStack_898._0_4_ = (float)uVar4;
          fStack_658 = (float)uStack_898;
          uStack_898._4_4_ = (float)((ulong)uVar4 >> 0x20);
          fStack_654 = uStack_898._4_4_;
          uStack_890._0_4_ = (float)uVar5;
          fStack_650 = (float)uStack_890;
          uStack_890._4_4_ = (float)((ulong)uVar5 >> 0x20);
          fStack_64c = uStack_890._4_4_;
          uStack_888._0_4_ = (float)uVar6;
          fStack_648 = (float)uStack_888;
          uStack_888._4_4_ = (float)((ulong)uVar6 >> 0x20);
          fStack_644 = uStack_888._4_4_;
          local_680._0_4_ = (float)local_b40;
          local_680._4_4_ = (float)((ulong)local_b40 >> 0x20);
          uStack_678._0_4_ = (float)uStack_b38;
          uStack_678._4_4_ = (float)((ulong)uStack_b38 >> 0x20);
          uStack_670._0_4_ = (float)uStack_b30;
          uStack_670._4_4_ = (float)((ulong)uStack_b30 >> 0x20);
          uStack_668._0_4_ = (float)uStack_b28;
          local_1e0 = (float)local_8a0 * (float)local_680;
          fStack_1dc = local_8a0._4_4_ * local_680._4_4_;
          fStack_1d8 = (float)uStack_898 * (float)uStack_678;
          fStack_1d4 = uStack_898._4_4_ * uStack_678._4_4_;
          fStack_1d0 = (float)uStack_890 * (float)uStack_670;
          fStack_1cc = uStack_890._4_4_ * uStack_670._4_4_;
          fStack_1c8 = (float)uStack_888 * (float)uStack_668;
          local_200._0_4_ = (float)local_b60;
          local_200._4_4_ = (float)((ulong)local_b60 >> 0x20);
          uStack_1f8._0_4_ = (float)uStack_b58;
          uStack_1f8._4_4_ = (float)((ulong)uStack_b58 >> 0x20);
          uStack_1f0._0_4_ = (float)uStack_b50;
          uStack_1f0._4_4_ = (float)((ulong)uStack_b50 >> 0x20);
          uStack_1e8._0_4_ = (float)uStack_b48;
          uStack_1e8._4_4_ = (float)((ulong)uStack_b48 >> 0x20);
          local_b20 = CONCAT44(fStack_1dc + local_200._4_4_,local_1e0 + (float)local_200);
          uStack_b18 = CONCAT44(fStack_1d4 + uStack_1f8._4_4_,fStack_1d8 + (float)uStack_1f8);
          uStack_b10 = CONCAT44(fStack_1cc + uStack_1f0._4_4_,fStack_1d0 + (float)uStack_1f0);
          uStack_b08 = CONCAT44(uStack_888._4_4_ + uStack_1e8._4_4_,fStack_1c8 + (float)uStack_1e8);
          local_6c0 = local_b20;
          uStack_6b8 = uStack_b18;
          uStack_6b0 = uStack_b10;
          uStack_6a8 = uStack_b08;
          *(undefined8 *)local_ae8 = local_b20;
          *(undefined8 *)(local_ae8 + 2) = uStack_b18;
          *(undefined8 *)(local_ae8 + 4) = uStack_b10;
          *(undefined8 *)(local_ae8 + 6) = uStack_b08;
          local_a08 = local_ae8;
          local_8e0 = local_b60;
          uStack_8d8 = uStack_b58;
          uStack_8d0 = uStack_b50;
          uStack_8c8 = uStack_b48;
          local_8c0 = local_b40;
          uStack_8b8 = uStack_b38;
          uStack_8b0 = uStack_b30;
          uStack_8a8 = uStack_b28;
          local_8a0 = uVar3;
          uStack_898 = uVar4;
          uStack_890 = uVar5;
          uStack_888 = uVar6;
          local_688 = local_ae8;
          local_680 = local_b40;
          uStack_678 = uStack_b38;
          uStack_670 = uStack_b30;
          uStack_668 = uStack_b28;
          local_200 = local_b60;
          uStack_1f8 = uStack_b58;
          uStack_1f0 = uStack_b50;
          uStack_1e8 = uStack_b48;
          fStack_1c4 = fStack_644;
        }
      }
    }
    if (local_abc == 2) {
      local_bc4 = local_ab0->w;
      local_bc8 = local_ab0->h;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_c64 = 0; local_c64 < local_bc8; local_c64 = local_c64 + 1) {
          local_c70 = ncnn::Mat::row(local_ab0,local_c64);
          local_a48 = ncnn::Mat::operator_cast_to_float_(local_ab8);
          local_a48 = local_a48 + (local_c64 << 3);
          local_ca0 = *(undefined8 *)local_a48;
          uStack_c98 = *(undefined8 *)(local_a48 + 2);
          uStack_c90 = *(undefined8 *)(local_a48 + 4);
          uStack_c88 = *(undefined8 *)(local_a48 + 6);
          for (local_ca4 = 0; local_ca4 < local_bc4; local_ca4 = local_ca4 + 1) {
            local_a50 = local_c70;
            uVar3 = *(undefined8 *)local_c70;
            uVar4 = *(undefined8 *)(local_c70 + 2);
            uVar5 = *(undefined8 *)(local_c70 + 4);
            uVar6 = *(undefined8 *)(local_c70 + 6);
            local_4e0._0_4_ = (float)uVar3;
            local_4e0._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_4d8._0_4_ = (float)uVar4;
            uStack_4d8._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_4d0._0_4_ = (float)uVar5;
            uStack_4d0._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_4c8._0_4_ = (float)uVar6;
            uStack_4c8._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
            local_500._0_4_ = (float)local_ca0;
            local_500._4_4_ = (float)((ulong)local_ca0 >> 0x20);
            uStack_4f8._0_4_ = (float)uStack_c98;
            uStack_4f8._4_4_ = (float)((ulong)uStack_c98 >> 0x20);
            uStack_4f0._0_4_ = (float)uStack_c90;
            uStack_4f0._4_4_ = (float)((ulong)uStack_c90 >> 0x20);
            uStack_4e8._0_4_ = (float)uStack_c88;
            local_ce0 = CONCAT44(local_4e0._4_4_ * local_500._4_4_,
                                 (float)local_4e0 * (float)local_500);
            uStack_cd8 = CONCAT44(uStack_4d8._4_4_ * uStack_4f8._4_4_,
                                  (float)uStack_4d8 * (float)uStack_4f8);
            uStack_cd0 = CONCAT44(uStack_4d0._4_4_ * uStack_4f0._4_4_,
                                  (float)uStack_4d0 * (float)uStack_4f0);
            uStack_cc8 = CONCAT44(uStack_4c8._4_4_,(float)uStack_4c8 * (float)uStack_4e8);
            local_748 = local_c70;
            local_780 = local_ce0;
            uStack_778 = uStack_cd8;
            uStack_770 = uStack_cd0;
            uStack_768 = uStack_cc8;
            *(undefined8 *)local_c70 = local_ce0;
            *(undefined8 *)(local_c70 + 2) = uStack_cd8;
            *(undefined8 *)(local_c70 + 4) = uStack_cd0;
            *(undefined8 *)(local_c70 + 6) = uStack_cc8;
            local_c70 = local_c70 + 8;
            local_500 = local_ca0;
            uStack_4f8 = uStack_c98;
            uStack_4f0 = uStack_c90;
            uStack_4e8 = uStack_c88;
            local_4e0 = uVar3;
            uStack_4d8 = uVar4;
            uStack_4d0 = uVar5;
            uStack_4c8 = uVar6;
          }
        }
      }
      else {
        for (local_bcc = 0; local_bcc < local_bc8; local_bcc = local_bcc + 1) {
          local_bd8 = ncnn::Mat::row(local_ab0,local_bcc);
          local_a30 = ncnn::Mat::operator_cast_to_float_(local_ab8);
          local_a30 = local_a30 + (local_bcc << 3);
          local_c00 = *(undefined8 *)local_a30;
          uStack_bf8 = *(undefined8 *)(local_a30 + 2);
          uStack_bf0 = *(undefined8 *)(local_a30 + 4);
          uStack_be8 = *(undefined8 *)(local_a30 + 6);
          local_a38 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_a38 = local_a38 + (local_bcc << 3);
          local_c20 = *(undefined8 *)local_a38;
          uStack_c18 = *(undefined8 *)(local_a38 + 2);
          uStack_c10 = *(undefined8 *)(local_a38 + 4);
          uStack_c08 = *(undefined8 *)(local_a38 + 6);
          for (local_c24 = 0; local_c24 < local_bc4; local_c24 = local_c24 + 1) {
            local_a40 = local_bd8;
            uVar3 = *(undefined8 *)local_bd8;
            uVar4 = *(undefined8 *)(local_bd8 + 2);
            uVar5 = *(undefined8 *)(local_bd8 + 4);
            uVar6 = *(undefined8 *)(local_bd8 + 6);
            local_920 = local_c00;
            uStack_918 = uStack_bf8;
            uStack_910 = uStack_bf0;
            uStack_908 = uStack_be8;
            local_900._0_4_ = (float)uVar3;
            local_620 = (float)local_900;
            local_900._4_4_ = (float)((ulong)uVar3 >> 0x20);
            fStack_61c = local_900._4_4_;
            uStack_8f8._0_4_ = (float)uVar4;
            fStack_618 = (float)uStack_8f8;
            uStack_8f8._4_4_ = (float)((ulong)uVar4 >> 0x20);
            fStack_614 = uStack_8f8._4_4_;
            uStack_8f0._0_4_ = (float)uVar5;
            fStack_610 = (float)uStack_8f0;
            uStack_8f0._4_4_ = (float)((ulong)uVar5 >> 0x20);
            fStack_60c = uStack_8f0._4_4_;
            uStack_8e8._0_4_ = (float)uVar6;
            fStack_608 = (float)uStack_8e8;
            uStack_8e8._4_4_ = (float)((ulong)uVar6 >> 0x20);
            fStack_604 = uStack_8e8._4_4_;
            local_640._0_4_ = (float)local_c00;
            local_640._4_4_ = (float)((ulong)local_c00 >> 0x20);
            uStack_638._0_4_ = (float)uStack_bf8;
            uStack_638._4_4_ = (float)((ulong)uStack_bf8 >> 0x20);
            uStack_630._0_4_ = (float)uStack_bf0;
            uStack_630._4_4_ = (float)((ulong)uStack_bf0 >> 0x20);
            uStack_628._0_4_ = (float)uStack_be8;
            local_1a0 = (float)local_900 * (float)local_640;
            fStack_19c = local_900._4_4_ * local_640._4_4_;
            fStack_198 = (float)uStack_8f8 * (float)uStack_638;
            fStack_194 = uStack_8f8._4_4_ * uStack_638._4_4_;
            fStack_190 = (float)uStack_8f0 * (float)uStack_630;
            fStack_18c = uStack_8f0._4_4_ * uStack_630._4_4_;
            fStack_188 = (float)uStack_8e8 * (float)uStack_628;
            local_1c0._0_4_ = (float)local_c20;
            local_1c0._4_4_ = (float)((ulong)local_c20 >> 0x20);
            uStack_1b8._0_4_ = (float)uStack_c18;
            uStack_1b8._4_4_ = (float)((ulong)uStack_c18 >> 0x20);
            uStack_1b0._0_4_ = (float)uStack_c10;
            uStack_1b0._4_4_ = (float)((ulong)uStack_c10 >> 0x20);
            uStack_1a8._0_4_ = (float)uStack_c08;
            uStack_1a8._4_4_ = (float)((ulong)uStack_c08 >> 0x20);
            local_c60 = CONCAT44(fStack_19c + local_1c0._4_4_,local_1a0 + (float)local_1c0);
            uStack_c58 = CONCAT44(fStack_194 + uStack_1b8._4_4_,fStack_198 + (float)uStack_1b8);
            uStack_c50 = CONCAT44(fStack_18c + uStack_1b0._4_4_,fStack_190 + (float)uStack_1b0);
            uStack_c48 = CONCAT44(uStack_8e8._4_4_ + uStack_1a8._4_4_,fStack_188 + (float)uStack_1a8
                                 );
            local_708 = local_bd8;
            local_740 = local_c60;
            uStack_738 = uStack_c58;
            uStack_730 = uStack_c50;
            uStack_728 = uStack_c48;
            *(undefined8 *)local_bd8 = local_c60;
            *(undefined8 *)(local_bd8 + 2) = uStack_c58;
            *(undefined8 *)(local_bd8 + 4) = uStack_c50;
            *(undefined8 *)(local_bd8 + 6) = uStack_c48;
            local_bd8 = local_bd8 + 8;
            local_940 = local_c20;
            uStack_938 = uStack_c18;
            uStack_930 = uStack_c10;
            uStack_928 = uStack_c08;
            local_900 = uVar3;
            uStack_8f8 = uVar4;
            uStack_8f0 = uVar5;
            uStack_8e8 = uVar6;
            local_640 = local_c00;
            uStack_638 = uStack_bf8;
            uStack_630 = uStack_bf0;
            uStack_628 = uStack_be8;
            local_1c0 = local_c20;
            uStack_1b8 = uStack_c18;
            uStack_1b0 = uStack_c10;
            uStack_1a8 = uStack_c08;
            fStack_184 = fStack_604;
          }
        }
      }
    }
    if (local_abc == 3) {
      local_ce4 = local_ab0->w;
      local_ce8 = local_ab0->h;
      local_cec = local_ab0->c;
      local_cf0 = local_ce4 * local_ce8;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_de4 = 0; local_de4 < local_cec; local_de4 = local_de4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffecf0,
                             (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
          pfVar12 = ncnn::Mat::operator_cast_to_float_(&local_e38);
          ncnn::Mat::~Mat((Mat *)0x4fe625);
          local_df0 = pfVar12;
          local_a70 = ncnn::Mat::operator_cast_to_float_(local_ab8);
          local_a70 = local_a70 + (local_de4 << 3);
          local_e60 = *(undefined8 *)local_a70;
          uStack_e58 = *(undefined8 *)(local_a70 + 2);
          uStack_e50 = *(undefined8 *)(local_a70 + 4);
          uStack_e48 = *(undefined8 *)(local_a70 + 6);
          for (local_e64 = 0; local_e64 < local_cf0; local_e64 = local_e64 + 1) {
            local_a78 = local_df0;
            uVar3 = *(undefined8 *)local_df0;
            uVar4 = *(undefined8 *)(local_df0 + 2);
            uVar5 = *(undefined8 *)(local_df0 + 4);
            uVar6 = *(undefined8 *)(local_df0 + 6);
            local_520._0_4_ = (float)uVar3;
            local_520._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_518._0_4_ = (float)uVar4;
            uStack_518._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_510._0_4_ = (float)uVar5;
            uStack_510._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_508._0_4_ = (float)uVar6;
            uStack_508._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
            local_540._0_4_ = (float)local_e60;
            local_540._4_4_ = (float)((ulong)local_e60 >> 0x20);
            uStack_538._0_4_ = (float)uStack_e58;
            uStack_538._4_4_ = (float)((ulong)uStack_e58 >> 0x20);
            uStack_530._0_4_ = (float)uStack_e50;
            uStack_530._4_4_ = (float)((ulong)uStack_e50 >> 0x20);
            uStack_528._0_4_ = (float)uStack_e48;
            local_ea0 = CONCAT44(local_520._4_4_ * local_540._4_4_,
                                 (float)local_520 * (float)local_540);
            uStack_e98 = CONCAT44(uStack_518._4_4_ * uStack_538._4_4_,
                                  (float)uStack_518 * (float)uStack_538);
            uStack_e90 = CONCAT44(uStack_510._4_4_ * uStack_530._4_4_,
                                  (float)uStack_510 * (float)uStack_530);
            uStack_e88 = CONCAT44(uStack_508._4_4_,(float)uStack_508 * (float)uStack_528);
            local_7c8 = local_df0;
            local_800 = local_ea0;
            uStack_7f8 = uStack_e98;
            uStack_7f0 = uStack_e90;
            uStack_7e8 = uStack_e88;
            *(undefined8 *)local_df0 = local_ea0;
            *(undefined8 *)(local_df0 + 2) = uStack_e98;
            *(undefined8 *)(local_df0 + 4) = uStack_e90;
            *(undefined8 *)(local_df0 + 6) = uStack_e88;
            local_df0 = local_df0 + 8;
            local_540 = local_e60;
            uStack_538 = uStack_e58;
            uStack_530 = uStack_e50;
            uStack_528 = uStack_e48;
            local_520 = uVar3;
            uStack_518 = uVar4;
            uStack_510 = uVar5;
            uStack_508 = uVar6;
          }
        }
      }
      else {
        for (local_cf4 = 0; local_cf4 < local_cec; local_cf4 = local_cf4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffecf0,
                             (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
          pfVar12 = ncnn::Mat::operator_cast_to_float_(&local_d48);
          ncnn::Mat::~Mat((Mat *)0x4fe3a3);
          local_d00 = pfVar12;
          local_a58 = ncnn::Mat::operator_cast_to_float_(local_ab8);
          local_a58 = local_a58 + (local_cf4 << 3);
          local_d80 = *(undefined8 *)local_a58;
          uStack_d78 = *(undefined8 *)(local_a58 + 2);
          uStack_d70 = *(undefined8 *)(local_a58 + 4);
          uStack_d68 = *(undefined8 *)(local_a58 + 6);
          local_a60 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_a60 = local_a60 + (local_cf4 << 3);
          local_da0 = *(undefined8 *)local_a60;
          uStack_d98 = *(undefined8 *)(local_a60 + 2);
          uStack_d90 = *(undefined8 *)(local_a60 + 4);
          uStack_d88 = *(undefined8 *)(local_a60 + 6);
          for (local_da4 = 0; local_da4 < local_cf0; local_da4 = local_da4 + 1) {
            local_a68 = local_d00;
            uVar3 = *(undefined8 *)local_d00;
            uVar4 = *(undefined8 *)(local_d00 + 2);
            uVar5 = *(undefined8 *)(local_d00 + 4);
            uVar6 = *(undefined8 *)(local_d00 + 6);
            local_980 = local_d80;
            uStack_978 = uStack_d78;
            uStack_970 = uStack_d70;
            uStack_968 = uStack_d68;
            local_960._0_4_ = (float)uVar3;
            local_5e0 = (float)local_960;
            local_960._4_4_ = (float)((ulong)uVar3 >> 0x20);
            fStack_5dc = local_960._4_4_;
            uStack_958._0_4_ = (float)uVar4;
            fStack_5d8 = (float)uStack_958;
            uStack_958._4_4_ = (float)((ulong)uVar4 >> 0x20);
            fStack_5d4 = uStack_958._4_4_;
            uStack_950._0_4_ = (float)uVar5;
            fStack_5d0 = (float)uStack_950;
            uStack_950._4_4_ = (float)((ulong)uVar5 >> 0x20);
            fStack_5cc = uStack_950._4_4_;
            uStack_948._0_4_ = (float)uVar6;
            fStack_5c8 = (float)uStack_948;
            uStack_948._4_4_ = (float)((ulong)uVar6 >> 0x20);
            fStack_5c4 = uStack_948._4_4_;
            local_600._0_4_ = (float)local_d80;
            local_600._4_4_ = (float)((ulong)local_d80 >> 0x20);
            uStack_5f8._0_4_ = (float)uStack_d78;
            uStack_5f8._4_4_ = (float)((ulong)uStack_d78 >> 0x20);
            uStack_5f0._0_4_ = (float)uStack_d70;
            uStack_5f0._4_4_ = (float)((ulong)uStack_d70 >> 0x20);
            uStack_5e8._0_4_ = (float)uStack_d68;
            local_160 = (float)local_960 * (float)local_600;
            fStack_15c = local_960._4_4_ * local_600._4_4_;
            fStack_158 = (float)uStack_958 * (float)uStack_5f8;
            fStack_154 = uStack_958._4_4_ * uStack_5f8._4_4_;
            fStack_150 = (float)uStack_950 * (float)uStack_5f0;
            fStack_14c = uStack_950._4_4_ * uStack_5f0._4_4_;
            fStack_148 = (float)uStack_948 * (float)uStack_5e8;
            local_180._0_4_ = (float)local_da0;
            local_180._4_4_ = (float)((ulong)local_da0 >> 0x20);
            uStack_178._0_4_ = (float)uStack_d98;
            uStack_178._4_4_ = (float)((ulong)uStack_d98 >> 0x20);
            uStack_170._0_4_ = (float)uStack_d90;
            uStack_170._4_4_ = (float)((ulong)uStack_d90 >> 0x20);
            uStack_168._0_4_ = (float)uStack_d88;
            uStack_168._4_4_ = (float)((ulong)uStack_d88 >> 0x20);
            local_de0 = CONCAT44(fStack_15c + local_180._4_4_,local_160 + (float)local_180);
            uStack_dd8 = CONCAT44(fStack_154 + uStack_178._4_4_,fStack_158 + (float)uStack_178);
            uStack_dd0 = CONCAT44(fStack_14c + uStack_170._4_4_,fStack_150 + (float)uStack_170);
            uStack_dc8 = CONCAT44(uStack_948._4_4_ + uStack_168._4_4_,fStack_148 + (float)uStack_168
                                 );
            local_788 = local_d00;
            local_7c0 = local_de0;
            uStack_7b8 = uStack_dd8;
            uStack_7b0 = uStack_dd0;
            uStack_7a8 = uStack_dc8;
            *(undefined8 *)local_d00 = local_de0;
            *(undefined8 *)(local_d00 + 2) = uStack_dd8;
            *(undefined8 *)(local_d00 + 4) = uStack_dd0;
            *(undefined8 *)(local_d00 + 6) = uStack_dc8;
            local_d00 = local_d00 + 8;
            local_9a0 = local_da0;
            uStack_998 = uStack_d98;
            uStack_990 = uStack_d90;
            uStack_988 = uStack_d88;
            local_960 = uVar3;
            uStack_958 = uVar4;
            uStack_950 = uVar5;
            uStack_948 = uVar6;
            local_600 = local_d80;
            uStack_5f8 = uStack_d78;
            uStack_5f0 = uStack_d70;
            uStack_5e8 = uStack_d68;
            local_180 = local_da0;
            uStack_178 = uStack_d98;
            uStack_170 = uStack_d90;
            uStack_168 = uStack_d88;
            fStack_144 = fStack_5c4;
          }
        }
      }
    }
    local_a8c = 0;
  }
  else if (local_ac0 == 4) {
    if (local_abc == 1) {
      local_ea4 = local_ab0->w;
      local_eb0 = ncnn::Mat::operator_cast_to_float_(local_ab8);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_f04 = 0; local_f04 < local_ea4; local_f04 = local_f04 + 1) {
          pfVar12 = ncnn::Mat::operator_cast_to_float_(local_ab0);
          local_f10 = (undefined1 (*) [12])(pfVar12 + (local_f04 << 2));
          auVar11 = *local_f10;
          fStack_f14 = (float)((ulong)*(undefined8 *)(*local_f10 + 8) >> 0x20);
          local_418 = local_eb0 + (local_f04 << 2);
          local_f30 = *(undefined8 *)local_418;
          uStack_f28 = *(undefined8 *)(local_418 + 2);
          auVar1._12_4_ = fStack_f14;
          auVar1._0_12_ = auVar11;
          local_300._0_4_ = auVar11._0_4_;
          local_300._4_4_ = auVar11._4_4_;
          fStack_2f8 = auVar11._8_4_;
          local_310._0_4_ = (float)local_f30;
          local_310._4_4_ = (float)((ulong)local_f30 >> 0x20);
          uStack_308._0_4_ = (float)uStack_f28;
          uStack_308._4_4_ = (float)((ulong)uStack_f28 >> 0x20);
          local_f20 = (float)local_300._0_4_ * (float)local_310;
          fStack_f1c = (float)local_300._4_4_ * local_310._4_4_;
          fStack_f18 = fStack_2f8 * (float)uStack_308;
          fStack_f14 = fStack_f14 * uStack_308._4_4_;
          local_250 = CONCAT44(fStack_f1c,local_f20);
          uStack_248 = CONCAT44(fStack_f14,fStack_f18);
          *(undefined8 *)*local_f10 = local_250;
          *(undefined8 *)(*local_f10 + 8) = uStack_248;
          local_410 = local_f10;
          local_310 = local_f30;
          uStack_308 = uStack_f28;
          _local_300 = auVar1;
          local_238 = local_f10;
        }
      }
      else {
        local_eb8 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
        for (local_ebc = 0; local_ebc < local_ea4; local_ebc = local_ebc + 1) {
          local_ec8 = ncnn::Mat::operator_cast_to_float_(local_ab0);
          local_ec8 = local_ec8 + (local_ebc << 2);
          uVar3 = *(undefined8 *)local_ec8;
          uVar4 = *(undefined8 *)(local_ec8 + 2);
          local_400 = local_eb0 + (local_ebc << 2);
          local_ef0 = *(undefined8 *)local_400;
          uStack_ee8 = *(undefined8 *)(local_400 + 2);
          local_408 = local_eb8 + (local_ebc << 2);
          local_f00 = *(undefined8 *)local_408;
          uStack_ef8 = *(undefined8 *)(local_408 + 2);
          local_2e0._0_4_ = (float)uVar3;
          local_2e0._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_2d8._0_4_ = (float)uVar4;
          uStack_2d8._4_4_ = (float)((ulong)uVar4 >> 0x20);
          local_2f0._0_4_ = (float)local_ef0;
          local_2f0._4_4_ = (float)((ulong)local_ef0 >> 0x20);
          uStack_2e8._0_4_ = (float)uStack_ee8;
          uStack_2e8._4_4_ = (float)((ulong)uStack_ee8 >> 0x20);
          local_3a0._0_4_ = (float)local_2e0 * (float)local_2f0;
          local_3a0._4_4_ = local_2e0._4_4_ * local_2f0._4_4_;
          local_3a0._8_4_ = (float)uStack_2d8 * (float)uStack_2e8;
          local_3a0._12_4_ = uStack_2d8._4_4_ * uStack_2e8._4_4_;
          local_3b0._0_4_ = (float)local_f00;
          local_3b0._4_4_ = (float)((ulong)local_f00 >> 0x20);
          uStack_3a8._0_4_ = (float)uStack_ef8;
          uStack_3a8._4_4_ = (float)((ulong)uStack_ef8 >> 0x20);
          local_ee0 = CONCAT44(local_3a0._4_4_ + local_3b0._4_4_,local_3a0._0_4_ + (float)local_3b0)
          ;
          uStack_ed8 = CONCAT44(local_3a0._12_4_ + uStack_3a8._4_4_,
                                local_3a0._8_4_ + (float)uStack_3a8);
          local_230 = local_ee0;
          uStack_228 = uStack_ed8;
          *(undefined8 *)local_ec8 = local_ee0;
          *(undefined8 *)(local_ec8 + 2) = uStack_ed8;
          local_3f8 = local_ec8;
          local_3b0 = local_f00;
          uStack_3a8 = uStack_ef8;
          local_2f0 = local_ef0;
          uStack_2e8 = uStack_ee8;
          local_2e0 = uVar3;
          uStack_2d8 = uVar4;
          local_218 = local_ec8;
        }
      }
    }
    if (local_abc == 2) {
      local_f34 = local_ab0->w;
      local_f38 = local_ab0->h;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_f94 = 0; local_f94 < local_f38; local_f94 = local_f94 + 1) {
          local_fa0 = (undefined1 (*) [12])ncnn::Mat::row(local_ab0,local_f94);
          local_438 = ncnn::Mat::operator_cast_to_float_(local_ab8);
          local_438 = local_438 + (local_f94 << 2);
          local_fb0 = *(undefined8 *)local_438;
          uStack_fa8 = *(undefined8 *)(local_438 + 2);
          for (local_fb4 = 0; local_fb4 < local_f34; local_fb4 = local_fb4 + 1) {
            local_440 = local_fa0;
            auVar11 = *local_fa0;
            fStack_fc4 = (float)((ulong)*(undefined8 *)(*local_fa0 + 8) >> 0x20);
            auVar2._12_4_ = fStack_fc4;
            auVar2._0_12_ = auVar11;
            local_340._0_4_ = auVar11._0_4_;
            local_340._4_4_ = auVar11._4_4_;
            fStack_338 = auVar11._8_4_;
            local_350._0_4_ = (float)local_fb0;
            local_350._4_4_ = (float)((ulong)local_fb0 >> 0x20);
            uStack_348._0_4_ = (float)uStack_fa8;
            uStack_348._4_4_ = (float)((ulong)uStack_fa8 >> 0x20);
            local_fd0 = (float)local_340._0_4_ * (float)local_350;
            fStack_fcc = (float)local_340._4_4_ * local_350._4_4_;
            fStack_fc8 = fStack_338 * (float)uStack_348;
            fStack_fc4 = fStack_fc4 * uStack_348._4_4_;
            local_278 = local_fa0;
            local_290 = CONCAT44(fStack_fcc,local_fd0);
            uStack_288 = CONCAT44(fStack_fc4,fStack_fc8);
            *(undefined8 *)*local_fa0 = local_290;
            *(undefined8 *)(*local_fa0 + 8) = uStack_288;
            local_fa0 = (undefined1 (*) [12])(local_fa0[1] + 4);
            local_350 = local_fb0;
            uStack_348 = uStack_fa8;
            _local_340 = auVar2;
          }
        }
      }
      else {
        for (local_f3c = 0; local_f3c < local_f38; local_f3c = local_f3c + 1) {
          local_f48 = ncnn::Mat::row(local_ab0,local_f3c);
          local_420 = ncnn::Mat::operator_cast_to_float_(local_ab8);
          local_420 = local_420 + (local_f3c << 2);
          local_f60 = *(undefined8 *)local_420;
          uStack_f58 = *(undefined8 *)(local_420 + 2);
          local_428 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_428 = local_428 + (local_f3c << 2);
          local_f70 = *(undefined8 *)local_428;
          uStack_f68 = *(undefined8 *)(local_428 + 2);
          for (local_f74 = 0; local_f74 < local_f34; local_f74 = local_f74 + 1) {
            local_430 = local_f48;
            uVar3 = *(undefined8 *)local_f48;
            uVar4 = *(undefined8 *)(local_f48 + 2);
            local_320._0_4_ = (float)uVar3;
            local_320._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_318._0_4_ = (float)uVar4;
            uStack_318._4_4_ = (float)((ulong)uVar4 >> 0x20);
            local_330._0_4_ = (float)local_f60;
            local_330._4_4_ = (float)((ulong)local_f60 >> 0x20);
            uStack_328._0_4_ = (float)uStack_f58;
            uStack_328._4_4_ = (float)((ulong)uStack_f58 >> 0x20);
            local_3c0._0_4_ = (float)local_320 * (float)local_330;
            local_3c0._4_4_ = local_320._4_4_ * local_330._4_4_;
            local_3c0._8_4_ = (float)uStack_318 * (float)uStack_328;
            local_3c0._12_4_ = uStack_318._4_4_ * uStack_328._4_4_;
            local_3d0._0_4_ = (float)local_f70;
            local_3d0._4_4_ = (float)((ulong)local_f70 >> 0x20);
            uStack_3c8._0_4_ = (float)uStack_f68;
            uStack_3c8._4_4_ = (float)((ulong)uStack_f68 >> 0x20);
            local_f90 = CONCAT44(local_3c0._4_4_ + local_3d0._4_4_,
                                 local_3c0._0_4_ + (float)local_3d0);
            uStack_f88 = CONCAT44(local_3c0._12_4_ + uStack_3c8._4_4_,
                                  local_3c0._8_4_ + (float)uStack_3c8);
            local_258 = local_f48;
            local_270 = local_f90;
            uStack_268 = uStack_f88;
            *(undefined8 *)local_f48 = local_f90;
            *(undefined8 *)(local_f48 + 2) = uStack_f88;
            local_f48 = local_f48 + 4;
            local_3d0 = local_f70;
            uStack_3c8 = uStack_f68;
            local_330 = local_f60;
            uStack_328 = uStack_f58;
            local_320 = uVar3;
            uStack_318 = uVar4;
          }
        }
      }
    }
    if (local_abc == 3) {
      local_fd4 = local_ab0->w;
      local_fd8 = local_ab0->h;
      local_fdc = local_ab0->c;
      local_fe0 = local_fd4 * local_fd8;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_1084 = 0; local_1084 < local_fdc; local_1084 = local_1084 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffecf0,
                             (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
          pauVar13 = (undefined1 (*) [12])ncnn::Mat::operator_cast_to_float_(&local_10d8);
          ncnn::Mat::~Mat((Mat *)0x4ff1c6);
          local_1090 = pauVar13;
          local_460 = ncnn::Mat::operator_cast_to_float_(local_ab8);
          local_460 = local_460 + (local_1084 << 2);
          local_10f0 = *(undefined8 *)local_460;
          uStack_10e8 = *(undefined8 *)(local_460 + 2);
          for (local_10f4 = 0; local_10f4 < local_fe0; local_10f4 = local_10f4 + 1) {
            local_468 = local_1090;
            auVar11 = *local_1090;
            fStack_1104 = (float)((ulong)*(undefined8 *)(*local_1090 + 8) >> 0x20);
            auVar10._12_4_ = fStack_1104;
            auVar10._0_12_ = auVar11;
            local_380._0_4_ = auVar11._0_4_;
            local_380._4_4_ = auVar11._4_4_;
            fStack_378 = auVar11._8_4_;
            local_390._0_4_ = (float)local_10f0;
            local_390._4_4_ = (float)((ulong)local_10f0 >> 0x20);
            uStack_388._0_4_ = (float)uStack_10e8;
            uStack_388._4_4_ = (float)((ulong)uStack_10e8 >> 0x20);
            local_1110 = (float)local_380._0_4_ * (float)local_390;
            fStack_110c = (float)local_380._4_4_ * local_390._4_4_;
            fStack_1108 = fStack_378 * (float)uStack_388;
            fStack_1104 = fStack_1104 * uStack_388._4_4_;
            local_2b8 = local_1090;
            local_2d0 = CONCAT44(fStack_110c,local_1110);
            uStack_2c8 = CONCAT44(fStack_1104,fStack_1108);
            *(undefined8 *)*local_1090 = local_2d0;
            *(undefined8 *)(*local_1090 + 8) = uStack_2c8;
            local_1090 = (undefined1 (*) [12])(local_1090[1] + 4);
            local_390 = local_10f0;
            uStack_388 = uStack_10e8;
            _local_380 = auVar10;
          }
        }
      }
      else {
        for (local_fe4 = 0; local_fe4 < local_fdc; local_fe4 = local_fe4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffecf0,
                             (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
          pfVar12 = ncnn::Mat::operator_cast_to_float_(&local_1038);
          ncnn::Mat::~Mat((Mat *)0x4fef80);
          local_ff0 = pfVar12;
          local_448 = ncnn::Mat::operator_cast_to_float_(local_ab8);
          local_448 = local_448 + (local_fe4 << 2);
          local_1050 = *(undefined8 *)local_448;
          uStack_1048 = *(undefined8 *)(local_448 + 2);
          local_450 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_450 = local_450 + (local_fe4 << 2);
          local_1060 = *(undefined8 *)local_450;
          uStack_1058 = *(undefined8 *)(local_450 + 2);
          for (local_1064 = 0; local_1064 < local_fe0; local_1064 = local_1064 + 1) {
            local_458 = local_ff0;
            uVar3 = *(undefined8 *)local_ff0;
            uVar4 = *(undefined8 *)(local_ff0 + 2);
            local_360._0_4_ = (float)uVar3;
            local_360._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_358._0_4_ = (float)uVar4;
            uStack_358._4_4_ = (float)((ulong)uVar4 >> 0x20);
            local_370._0_4_ = (float)local_1050;
            local_370._4_4_ = (float)((ulong)local_1050 >> 0x20);
            uStack_368._0_4_ = (float)uStack_1048;
            uStack_368._4_4_ = (float)((ulong)uStack_1048 >> 0x20);
            local_3e0._0_4_ = (float)local_360 * (float)local_370;
            local_3e0._4_4_ = local_360._4_4_ * local_370._4_4_;
            local_3e0._8_4_ = (float)uStack_358 * (float)uStack_368;
            local_3e0._12_4_ = uStack_358._4_4_ * uStack_368._4_4_;
            local_3f0._0_4_ = (float)local_1060;
            local_3f0._4_4_ = (float)((ulong)local_1060 >> 0x20);
            uStack_3e8._0_4_ = (float)uStack_1058;
            uStack_3e8._4_4_ = (float)((ulong)uStack_1058 >> 0x20);
            local_1080 = CONCAT44(local_3e0._4_4_ + local_3f0._4_4_,
                                  local_3e0._0_4_ + (float)local_3f0);
            uStack_1078 = CONCAT44(local_3e0._12_4_ + uStack_3e8._4_4_,
                                   local_3e0._8_4_ + (float)uStack_3e8);
            local_298 = local_ff0;
            local_2b0 = local_1080;
            uStack_2a8 = uStack_1078;
            *(undefined8 *)local_ff0 = local_1080;
            *(undefined8 *)(local_ff0 + 2) = uStack_1078;
            local_ff0 = local_ff0 + 4;
            local_3f0 = local_1060;
            uStack_3e8 = uStack_1058;
            local_370 = local_1050;
            uStack_368 = uStack_1048;
            local_360 = uVar3;
            uStack_358 = uVar4;
          }
        }
      }
    }
    local_a8c = 0;
  }
  else if (local_abc == 3) {
    local_1114 = local_ab0->w;
    local_1118 = local_ab0->h;
    local_111c = local_ab0->c;
    local_1120 = local_1114 * local_1118;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
      local_1208 = ncnn::Mat::operator_cast_to_float_(local_ab8);
      for (local_120c = 0; local_120c < local_111c; local_120c = local_120c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20)
                          );
        pfVar12 = ncnn::Mat::operator_cast_to_float_(&local_1260);
        ncnn::Mat::~Mat((Mat *)0x4ff924);
        local_20c = local_1208[local_120c];
        local_1268 = (int)local_1120 >> 3;
        local_126c = local_1120 & 7;
        auVar1 = vinsertps_avx(ZEXT416((uint)local_20c),ZEXT416((uint)local_20c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_20c),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_20c),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)local_20c),ZEXT416((uint)local_20c),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20c),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20c),0x30);
        auVar15._16_16_ = auVar1;
        auVar15._0_16_ = auVar2;
        local_80._0_8_ = auVar2._0_8_;
        local_80._8_8_ = auVar2._8_8_;
        local_80._16_8_ = auVar1._0_8_;
        local_80._24_8_ = auVar1._8_8_;
        local_1218 = pfVar12;
        for (; 0 < local_1268; local_1268 = local_1268 + -1) {
          local_a88 = local_1218;
          uVar3 = *(undefined8 *)local_1218;
          uVar4 = *(undefined8 *)(local_1218 + 2);
          uVar5 = *(undefined8 *)(local_1218 + 4);
          uVar6 = *(undefined8 *)(local_1218 + 6);
          local_560._0_4_ = (float)uVar3;
          local_560._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_558._0_4_ = (float)uVar4;
          uStack_558._4_4_ = (float)((ulong)uVar4 >> 0x20);
          uStack_550._0_4_ = (float)uVar5;
          uStack_550._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_548._0_4_ = (float)uVar6;
          uStack_548._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          local_580._0_4_ = auVar2._0_4_;
          local_580._4_4_ = auVar2._4_4_;
          uStack_578._0_4_ = auVar2._8_4_;
          uStack_578._4_4_ = auVar2._12_4_;
          uStack_570._0_4_ = auVar1._0_4_;
          uStack_570._4_4_ = auVar1._4_4_;
          uStack_568._0_4_ = auVar1._8_4_;
          local_12c0 = CONCAT44(local_560._4_4_ * local_580._4_4_,
                                (float)local_560 * (float)local_580);
          uStack_12b8 = CONCAT44(uStack_558._4_4_ * uStack_578._4_4_,
                                 (float)uStack_558 * (float)uStack_578);
          uStack_12b0 = CONCAT44(uStack_550._4_4_ * uStack_570._4_4_,
                                 (float)uStack_550 * (float)uStack_570);
          uStack_12a8 = CONCAT44(uStack_548._4_4_,(float)uStack_548 * (float)uStack_568);
          local_848 = local_1218;
          local_880 = local_12c0;
          uStack_878 = uStack_12b8;
          uStack_870 = uStack_12b0;
          uStack_868 = uStack_12a8;
          *(undefined8 *)local_1218 = local_12c0;
          *(undefined8 *)(local_1218 + 2) = uStack_12b8;
          *(undefined8 *)(local_1218 + 4) = uStack_12b0;
          *(undefined8 *)(local_1218 + 6) = uStack_12a8;
          local_1218 = local_1218 + 8;
          local_580 = local_80._0_8_;
          uStack_578 = local_80._8_8_;
          uStack_570 = local_80._16_8_;
          uStack_568 = local_80._24_8_;
          local_560 = uVar3;
          uStack_558 = uVar4;
          uStack_550 = uVar5;
          uStack_548 = uVar6;
        }
        for (; 0 < (int)local_126c; local_126c = local_126c - 1) {
          *local_1218 = local_20c * *local_1218;
          local_1218 = local_1218 + 1;
        }
        local_80 = auVar15;
        local_50 = local_20c;
        local_4c = local_20c;
        local_48 = local_20c;
        local_44 = local_20c;
        local_40 = local_20c;
        local_3c = local_20c;
        local_38 = local_20c;
        local_34 = local_20c;
      }
    }
    else {
      local_1128 = ncnn::Mat::operator_cast_to_float_(local_ab8);
      local_1130 = ncnn::Mat::operator_cast_to_float_
                             ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
      for (local_1134 = 0; local_1134 < local_111c; local_1134 = local_1134 + 1) {
        this_00 = &local_1188;
        ncnn::Mat::channel(in_stack_ffffffffffffecf0,(int)((ulong)this_00 >> 0x20));
        in_stack_ffffffffffffecf0 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
        ncnn::Mat::~Mat((Mat *)0x4ff47a);
        local_204 = local_1128[local_1134];
        local_208 = local_1130[local_1134];
        local_1194 = (int)local_1120 >> 3;
        local_1198 = local_1120 & 7;
        auVar1 = vinsertps_avx(ZEXT416((uint)local_204),ZEXT416((uint)local_204),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_204),0x20);
        local_100 = vinsertps_avx(auVar1,ZEXT416((uint)local_204),0x30);
        auVar1 = vinsertps_avx(ZEXT416((uint)local_204),ZEXT416((uint)local_204),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_204),0x20);
        auStack_f0 = vinsertps_avx(auVar1,ZEXT416((uint)local_204),0x30);
        auVar1 = vinsertps_avx(ZEXT416((uint)local_208),ZEXT416((uint)local_208),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_208),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_208),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)local_208),ZEXT416((uint)local_208),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_208),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_208),0x30);
        auVar14._16_16_ = auVar1;
        auVar14._0_16_ = auVar2;
        local_c0._0_8_ = auVar2._0_8_;
        local_c0._8_8_ = auVar2._8_8_;
        local_c0._16_8_ = auVar1._0_8_;
        local_c0._24_8_ = auVar1._8_8_;
        local_11e0 = local_c0._0_8_;
        local_1140 = in_stack_ffffffffffffecf0;
        for (; 0 < local_1194; local_1194 = local_1194 + -1) {
          local_a80 = local_1140;
          pvVar7 = local_1140->data;
          piVar8 = local_1140->refcount;
          sVar9 = local_1140->elemsize;
          uVar3 = *(undefined8 *)&local_1140->elempack;
          local_9e0 = local_100._0_8_;
          uStack_9d8 = local_100._8_8_;
          uStack_9d0 = auStack_f0._0_8_;
          uStack_9c8 = auStack_f0._8_8_;
          local_a00 = local_c0._0_8_;
          uStack_9f8 = local_c0._8_8_;
          uStack_9f0 = local_c0._16_8_;
          uStack_9e8 = local_c0._24_8_;
          local_9c0._0_4_ = SUB84(pvVar7,0);
          local_5a0 = (float)local_9c0;
          local_9c0._4_4_ = (float)((ulong)pvVar7 >> 0x20);
          fStack_59c = local_9c0._4_4_;
          uStack_9b8._0_4_ = SUB84(piVar8,0);
          fStack_598 = (float)uStack_9b8;
          uStack_9b8._4_4_ = (float)((ulong)piVar8 >> 0x20);
          fStack_594 = uStack_9b8._4_4_;
          uStack_9b0._0_4_ = (float)sVar9;
          fStack_590 = (float)uStack_9b0;
          uStack_9b0._4_4_ = (float)(sVar9 >> 0x20);
          fStack_58c = uStack_9b0._4_4_;
          uStack_9a8._0_4_ = (float)uVar3;
          fStack_588 = (float)uStack_9a8;
          uStack_9a8._4_4_ = (float)((ulong)uVar3 >> 0x20);
          fStack_584 = uStack_9a8._4_4_;
          local_5c0._0_4_ = local_100._0_4_;
          local_5c0._4_4_ = local_100._4_4_;
          uStack_5b8._0_4_ = local_100._8_4_;
          uStack_5b8._4_4_ = local_100._12_4_;
          uStack_5b0._0_4_ = auStack_f0._0_4_;
          uStack_5b0._4_4_ = auStack_f0._4_4_;
          uStack_5a8._0_4_ = auStack_f0._8_4_;
          local_120 = (float)local_9c0 * (float)local_5c0;
          fStack_11c = local_9c0._4_4_ * local_5c0._4_4_;
          fStack_118 = (float)uStack_9b8 * (float)uStack_5b8;
          fStack_114 = uStack_9b8._4_4_ * uStack_5b8._4_4_;
          fStack_110 = (float)uStack_9b0 * (float)uStack_5b0;
          fStack_10c = uStack_9b0._4_4_ * uStack_5b0._4_4_;
          fStack_108 = (float)uStack_9a8 * (float)uStack_5a8;
          local_140._0_4_ = auVar2._0_4_;
          local_140._4_4_ = auVar2._4_4_;
          uStack_138._0_4_ = auVar2._8_4_;
          uStack_138._4_4_ = auVar2._12_4_;
          uStack_130._0_4_ = auVar1._0_4_;
          uStack_130._4_4_ = auVar1._4_4_;
          uStack_128._0_4_ = auVar1._8_4_;
          uStack_128._4_4_ = auVar1._12_4_;
          local_1200 = (void *)CONCAT44(fStack_11c + local_140._4_4_,local_120 + (float)local_140);
          uStack_11f8 = (int *)CONCAT44(fStack_114 + uStack_138._4_4_,fStack_118 + (float)uStack_138
                                       );
          uStack_11f0 = CONCAT44(fStack_10c + uStack_130._4_4_,fStack_110 + (float)uStack_130);
          uStack_11e8 = CONCAT44(uStack_9a8._4_4_ + uStack_128._4_4_,fStack_108 + (float)uStack_128)
          ;
          local_808 = local_1140;
          local_840 = local_1200;
          piStack_838 = uStack_11f8;
          sStack_830 = uStack_11f0;
          uStack_828 = uStack_11e8;
          local_1140->data = local_1200;
          local_1140->refcount = uStack_11f8;
          local_1140->elemsize = uStack_11f0;
          *(undefined8 *)&local_1140->elempack = uStack_11e8;
          local_1140 = (Mat *)&local_1140->allocator;
          local_9c0 = pvVar7;
          uStack_9b8 = piVar8;
          uStack_9b0 = sVar9;
          uStack_9a8 = uVar3;
          local_5c0 = local_100._0_8_;
          uStack_5b8 = local_100._8_8_;
          uStack_5b0 = auStack_f0._0_8_;
          uStack_5a8 = auStack_f0._8_8_;
          local_140 = local_c0._0_8_;
          uStack_138 = local_c0._8_8_;
          uStack_130 = local_c0._16_8_;
          uStack_128 = local_c0._24_8_;
          fStack_104 = fStack_584;
        }
        for (; 0 < (int)local_1198; local_1198 = local_1198 - 1) {
          *(float *)&local_1140->data = *(float *)&local_1140->data * local_204 + local_208;
          local_1140 = (Mat *)((long)&local_1140->data + 4);
        }
        local_e0 = local_204;
        local_dc = local_204;
        local_d8 = local_204;
        local_d4 = local_204;
        local_d0 = local_204;
        local_cc = local_204;
        local_c8 = local_204;
        local_c4 = local_204;
        local_c0 = auVar14;
        local_a0 = local_208;
        local_9c = local_208;
        local_98 = local_208;
        local_94 = local_208;
        local_90 = local_208;
        local_8c = local_208;
        local_88 = local_208;
        local_84 = local_208;
      }
    }
    local_a8c = 0;
  }
  else {
    local_a8c = Scale::forward_inplace
                          (in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,
                           in_stack_ffffffffffffee28);
  }
  return local_a8c;
}

Assistant:

int Scale_x86_avx::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    __m256 _bias = _mm256_loadu_ps(bias + i * 8);
                    _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    _p = _mm256_mul_ps(_p, _s);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    __m128 _bias = _mm_loadu_ps(bias + i * 4);
                    _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                    _mm_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    _p = _mm_mul_ps(_p, _s);
                    _mm_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return Scale::forward_inplace(bottom_top_blobs, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (bias_term)
    {
        const float* scale_ptr = scale_blob;
        const float* bias_ptr = bias_data;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];
            float bias = bias_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            __m256 _bias = _mm256_set1_ps(bias);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr = *ptr * s + bias;

                ptr++;
            }
        }
    }
    else
    {
        const float* scale_ptr = scale_blob;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _s);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr *= s;

                ptr++;
            }
        }
    }

    return 0;
}